

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O3

void __thiscall Arena_ConDecon_Test::~Arena_ConDecon_Test(Arena_ConDecon_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Arena, ConDecon) {
  memt::Arena arena;
  arena.freeTopArray(arena.allocArray<ConDeconHelper>(0));
  arena.freeTopArray(arena.allocArray<ConDeconHelper>(3));
  arena.freeTopArray(arena.allocArray<ConDeconHelper>(0));
  ASSERT_EQ(ConDeconHelper::resetLog(), "+1+2+3-3-2-1");
  ASSERT_TRUE(arena.isEmpty());
}